

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool array_container_equal_bitset(array_container_t *container1,bitset_container_t *container2)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  _Bool _Var8;
  
  if ((container2->cardinality != -1) && (container2->cardinality != container1->cardinality)) {
    return false;
  }
  uVar4 = 0;
  bVar7 = false;
  iVar3 = 0;
  do {
    uVar6 = container2->words[uVar4];
    do {
      uVar5 = uVar6;
      if (uVar5 == 0) break;
      if (iVar3 < container1->cardinality) {
        lVar1 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        if (((uint)lVar1 | (int)uVar4 << 6) != (uint)container1->array[iVar3]) goto LAB_0010ce6e;
        iVar3 = iVar3 + 1;
        bVar2 = true;
        uVar6 = uVar5 - 1 & uVar5;
      }
      else {
LAB_0010ce6e:
        bVar2 = false;
        uVar6 = uVar5;
      }
    } while (bVar2);
    if (uVar5 != 0) break;
    bVar7 = 0x3fe < uVar4;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x400);
  if (bVar7) {
    _Var8 = iVar3 == container1->cardinality;
  }
  else {
    _Var8 = false;
  }
  return _Var8;
}

Assistant:

bool array_container_equal_bitset(const array_container_t* container1,
                                  const bitset_container_t* container2) {
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality != container1->cardinality) {
            return false;
        }
    }
    int32_t pos = 0;
    for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i) {
        uint64_t w = container2->words[i];
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            uint16_t r = i * 64 + __builtin_ctzll(w);
            if (pos >= container1->cardinality) {
                return false;
            }
            if (container1->array[pos] != r) {
                return false;
            }
            ++pos;
            w ^= t;
        }
    }
    return (pos == container1->cardinality);
}